

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O3

int __thiscall MatroskaDemuxer::matroska_parse_cluster(MatroskaDemuxer *this)

{
  int *levelUp;
  int64_t pos;
  int iVar1;
  int iVar2;
  int64_t cluster_time;
  int size;
  uint32_t id;
  uint8_t *data;
  int in_stack_ffffffffffffffa0;
  int local_4c;
  uint32_t local_48;
  undefined4 uStack_44;
  uint8_t *local_40;
  uint32_t local_34;
  
  levelUp = &this->level_up;
  iVar1 = 0;
  cluster_time = 0;
  do {
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = ebml_read_element_id(this,&local_48,levelUp);
    if (iVar1 < 0) {
      return -1;
    }
    if (local_48 == 0) {
      return -1;
    }
    iVar2 = *levelUp;
    if (iVar2 != 0) {
      iVar1 = 0;
      break;
    }
    if ((int)local_48 < 0xe7) {
      if (local_48 == 0xa0) {
        iVar1 = ebml_read_master(this,&local_34);
        if (-1 < iVar1) {
          iVar1 = matroska_parse_blockgroup(this,cluster_time);
        }
      }
      else {
        if (local_48 != 0xa3) goto LAB_0019c226;
        pos = (this->super_IOContextDemuxer).m_processedBytes;
        iVar1 = ebml_read_binary(this,&local_34,&local_40,&local_4c);
        if (iVar1 == 0) {
          iVar1 = matroska_parse_block
                            (this,local_40,local_4c,pos,cluster_time,-0x8000000000000000,-1,
                             in_stack_ffffffffffffffa0);
        }
      }
    }
    else if (local_48 == 0xe7) {
      iVar1 = ebml_read_uint(this,&local_34,(int64_t *)&local_48);
      if (-1 < iVar1) {
        cluster_time = CONCAT44(uStack_44,local_48);
      }
    }
    else {
      if ((local_48 != 0xec) && (local_48 == 0x1f43b675)) {
        return 0;
      }
LAB_0019c226:
      iVar1 = ebml_read_skip(this);
    }
    iVar2 = *levelUp;
  } while (iVar2 == 0);
  *levelUp = iVar2 + -1;
  return iVar1;
}

Assistant:

int MatroskaDemuxer::matroska_parse_cluster()
{
    int res = 0;
    uint32_t id;
    int64_t cluster_time = 0;
    uint8_t *data;
    int64_t pos;
    int size;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* cluster timecode */
        case MATROSKA_ID_CLUSTERTIMECODE:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                break;
            cluster_time = num;
            break;
        }

        /* a group of blocks inside a cluster */
        case MATROSKA_ID_BLOCKGROUP:
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_blockgroup(cluster_time);
            break;

        case MATROSKA_ID_SIMPLEBLOCK:
            pos = m_processedBytes;
            res = ebml_read_binary(&id, &data, &size);
            if (res == 0)
                res = matroska_parse_block(data, size, pos, cluster_time, AV_NOPTS_VALUE, -1, 0);
            break;

        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        // Don't know why here is the next cluster without level up. Probably file error
        // TODO: does the EBML need to be skipped ?
        case MATROSKA_ID_CLUSTER:
            return 0;
        default:
            LTRACE(LT_WARN, 0, "Unknown entry " << id << " in cluster data");
            res = ebml_read_skip();
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    return res;
}